

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dropt.c
# Opt level: O1

dropt_error
handle_ip_address(dropt_context *context,dropt_option *option,dropt_char *optionArgument,void *dest)

{
  int iVar1;
  ushort **ppuVar2;
  long lVar3;
  byte *pbVar4;
  ulong uVar5;
  dropt_error dVar6;
  bool bVar7;
  uint octet [4];
  uint local_38 [4];
  
  if (dest == (void *)0x0) {
    __assert_fail("out != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/test_dropt.c"
                  ,0xaa,
                  "dropt_error handle_ip_address(dropt_context *, const dropt_option *, const dropt_char *, void *)"
                 );
  }
  dVar6 = 5;
  if ((optionArgument != (dropt_char *)0x0) && (*optionArgument != '\0')) {
    uVar5 = (ulong)(byte)*optionArgument;
    bVar7 = uVar5 == 0;
    dVar6 = 0;
    if (!bVar7) {
      ppuVar2 = __ctype_b_loc();
      if ((uVar5 == 0x2e) || (((*ppuVar2)[uVar5] & 0x800) != 0)) {
        pbVar4 = (byte *)(optionArgument + 1);
        do {
          uVar5 = (ulong)*pbVar4;
          bVar7 = uVar5 == 0;
          dVar6 = 0;
          if (bVar7) goto LAB_001053be;
          pbVar4 = pbVar4 + 1;
        } while ((uVar5 == 0x2e) || (((*ppuVar2)[uVar5] & 0x800) != 0));
      }
      dVar6 = 0x80;
    }
LAB_001053be:
    if (bVar7) {
      iVar1 = __isoc99_sscanf(optionArgument,"%u.%u.%u.%u",local_38,local_38 + 1,local_38 + 2,
                              local_38 + 3);
      if (iVar1 == 4) {
        lVar3 = 0;
        do {
          if (0xff < local_38[lVar3]) goto LAB_00105420;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        *(uint *)dest = local_38[2] << 8 | local_38[1] << 0x10 | local_38[0] << 0x18 | local_38[3];
      }
      else {
LAB_00105420:
        dVar6 = 0x80;
      }
    }
  }
  return dVar6;
}

Assistant:

static dropt_error
handle_ip_address(dropt_context* context,
                  const dropt_option* option,
                  const dropt_char* optionArgument,
                  void* dest)
{
    dropt_error err = dropt_error_none;
    unsigned int octet[4];
    size_t i;

    unsigned int* out = dest;

    assert(out != NULL);

    if (optionArgument == NULL || optionArgument[0] == T('\0'))
    {
        err = dropt_error_insufficient_arguments;
        goto exit;
    }

    {
        const dropt_char* p = optionArgument;
        while (*p != T('\0'))
        {
            if (!istdigit(*p) && *p != T('.'))
            {
                err = my_dropt_error_bad_ip_address;
                goto exit;
            }
            p++;
        }
    }

    if (stscanf(optionArgument, T("%u.%u.%u.%u"),
                &octet[0], &octet[1], &octet[2], &octet[3])
        != ARRAY_LENGTH(octet))
    {
        err = my_dropt_error_bad_ip_address;
        goto exit;
    }

    for (i = 0; i < ARRAY_LENGTH(octet); i++)
    {
        if (octet[i] > 0xFF)
        {
            err = my_dropt_error_bad_ip_address;
            goto exit;
        }
    }

    *out = (octet[0] << 24) | (octet[1] << 16) | (octet[2] << 8) | octet[3];

exit:
    return err;
}